

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O0

void __thiscall SocketOnline::send_message(SocketOnline *this,Mat *a)

{
  int u;
  Mat *in_RSI;
  long in_RDI;
  SocketOnline *unaff_retaddr;
  int len_buffer;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  long lVar1;
  SOCK sock;
  
  lVar1 = in_RDI;
  u = Mat::toString_pos(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                       );
  sock = (SOCK)((ulong)lVar1 >> 0x20);
  Constant::Util::int_to_header(*(char **)(in_RDI + 0x10),u);
  send_message_n(unaff_retaddr,sock,(char *)in_RSI,u);
  send_message_n(unaff_retaddr,sock,(char *)in_RSI,u);
  return;
}

Assistant:

void SocketOnline::send_message(const Mat &a) {
    int len_buffer;
    len_buffer = a.toString_pos(buffer);
    Constant::Util::int_to_header(header, len_buffer);
    send_message_n(sock, header, HEADER_LEN);
    send_message_n(sock, buffer, len_buffer);
}